

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  key_type kVar7;
  Type type;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  AssertionResult *assertion_result;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  stringstream string_buffer;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  allocator_type *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  hasher *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  Type in_stack_fffffffffffffa0c;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa20;
  undefined2 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa42;
  value_type in_stack_fffffffffffffa4c;
  uint i_00;
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  string local_580 [48];
  key_type local_550;
  undefined1 local_549;
  AssertionResult local_548;
  string local_538 [48];
  key_type local_508;
  undefined1 local_501;
  AssertionResult local_500 [2];
  key_type local_4dc;
  dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_4d8;
  Type local_4b4;
  AssertionResult local_4b0;
  string local_4a0 [48];
  key_type local_470;
  undefined1 local_469;
  AssertionResult local_468 [2];
  key_type local_444;
  dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_440;
  value_type local_41c;
  AssertionResult local_418 [2];
  key_type local_3f4;
  dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3f0;
  value_type local_3cc;
  AssertionResult local_3c8;
  string local_3b8 [55];
  undefined1 local_381;
  AssertionResult local_380;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_370 [2];
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_348;
  string local_2c8 [55];
  undefined1 local_291;
  AssertionResult local_290;
  stringstream local_280 [392];
  key_type local_f8;
  key_type local_f4;
  value_type local_c8;
  int local_c4;
  key_type local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  undefined1 local_94 [148];
  
  bVar1 = google::
          HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    this_02 = (BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_94;
    i_00 = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    assertion_result = (AssertionResult *)(ulong)i_00;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,i_00,(int *)assertion_result)
    ;
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              (in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_c0 = kVar4;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    for (local_c4 = 1; local_c4 < 100; local_c4 = local_c4 + 1) {
      in_stack_fffffffffffffa4c =
           HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
      local_c8 = in_stack_fffffffffffffa4c;
      google::
      BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(this_02,(value_type *)assertion_result);
    }
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_f4 = kVar5;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff9e0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    kVar6 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_f8 = kVar6;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff9e0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    std::__cxx11::stringstream::stringstream(local_280);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                      ((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)(local_94 + 0xc),local_280);
    local_291 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf9e263);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffffa42,
                                                                in_stack_fffffffffffffa40))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_2c8);
      testing::Message::~Message((Message *)0xf9e33f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9e3d6);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_370,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              (in_stack_fffffffffffffa10,
               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
               in_stack_fffffffffffffa00,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               in_stack_fffffffffffff9f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_370);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<int>,std::__cxx11::stringstream>
                      (&local_348,local_280);
    local_381 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf9e484);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa10);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa40))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_3b8);
      testing::Message::~Message((Message *)0xf9e598);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9e62f);
    local_3cc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_3f4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa20,
           (key_type *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    google::
    dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_3f0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char *)in_stack_fffffffffffff9f0,
               (int *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (int *)in_stack_fffffffffffff9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa10);
      testing::AssertionResult::failure_message((AssertionResult *)0xf9e70f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      testing::Message::~Message((Message *)0xf9e76c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9e7dd);
    local_41c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_444 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa20,
           (key_type *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    google::
    dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_440);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char *)in_stack_fffffffffffff9f0,
               (int *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (int *)in_stack_fffffffffffff9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa10);
      in_stack_fffffffffffffa20 =
           (BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf9e8bd);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      testing::Message::~Message((Message *)0xf9e91a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9e98b);
    kVar7 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_470 = kVar7;
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_469 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf9e9f3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_468);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa40))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffa0c,(char *)in_stack_fffffffffffffa00,
                 in_stack_fffffffffffff9fc,(char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_4a0);
      testing::Message::~Message((Message *)0xf9eac8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9eb5f);
    type = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_4b4 = type;
    local_4dc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa20,(key_type *)CONCAT44(kVar7,in_stack_fffffffffffffa18));
    google::
    dense_hashtable_const_iterator<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_4d8);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char *)in_stack_fffffffffffff9f0,
               (int *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (int *)in_stack_fffffffffffff9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffa00 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xf9ec3f);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      testing::Message::~Message((Message *)0xf9ec9c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9ed0d);
    kVar7 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    local_508 = kVar7;
    message = (char *)google::
                      BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff9e0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_501 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf9ed75);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_500);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa40))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffa00,kVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_538);
      testing::Message::~Message((Message *)0xf9ee4a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9eee1);
    local_550 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff9e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_549 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf9ef49);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_548);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,(char *)CONCAT44(i_00,kVar4),
                 (char *)CONCAT44(in_stack_fffffffffffffa4c,kVar5),
                 (char *)CONCAT44(kVar6,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffa40))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffa00,kVar7,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_02,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_580);
      testing::Message::~Message((Message *)0xf9f01e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9f0b2);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf9f0bf);
    std::__cxx11::stringstream::~stringstream(local_280);
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashSet
              ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf9f0d9);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}